

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void door_handling_interior(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  doorindex_t *pdVar5;
  ulong uVar6;
  ulong uVar7;
  
  pdVar5 = state->interior_doors;
  while( true ) {
    bVar1 = *pdVar5;
    if (bVar1 == 0xff) {
      return;
    }
    state->current_door = bVar1;
    uVar6 = (ulong)(bVar1 >> 7);
    bVar2 = doors[(ulong)(bVar1 & 0x7f) * 2 + uVar6].room_and_direction;
    if (((((vischar->direction ^ bVar2) & 3) == 0) &&
        (uVar7 = (ulong)(bVar1 & 0x7f), bVar1 = doors[uVar7 * 2 + uVar6].mappos.u,
        uVar3 = (state->saved_mappos).pos16.u,
        uVar3 <= (ushort)(bVar1 + 3) && (int)(bVar1 - 3) < (int)(uint)uVar3)) &&
       (bVar1 = doors[uVar7 * 2 + uVar6].mappos.v, uVar3 = (state->saved_mappos).pos16.v,
       uVar3 <= (ushort)(bVar1 + 3) && (int)(bVar1 - 3) < (int)(uint)uVar3)) break;
    pdVar5 = pdVar5 + 1;
  }
  iVar4 = is_door_locked(state);
  if (iVar4 != 0) {
    return;
  }
  vischar->room = bVar2 >> 2;
  transition(state,&doors[uVar7 * 2 + uVar6 + (ulong)(-1 < (char)state->current_door) * 2 + -1].
                    mappos);
  return;
}

Assistant:

void door_handling_interior(tgestate_t *state, vischar_t *vischar)
{
  doorindex_t     *pdoors;         /* was HL */
  doorindex_t      current_door;   /* was A */
  uint8_t          room_and_flags; /* was A */
  const door_t    *door;           /* was HL' */
  const mappos8_t *doormappos;     /* was HL' */
  mappos16_t      *mappos;         /* was DE' */
  uint8_t          u;              /* was A */
  uint8_t          v;              /* was A */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  for (pdoors = &state->interior_doors[0]; ; pdoors++)
  {
    current_door = *pdoors;
    if (current_door == interiordoor_NONE)
      return; /* Reached end of list. */

    state->current_door = current_door;

    door = get_door(current_door);
    room_and_flags = door->room_and_direction;

    /* Does the character face the same direction as the door? */
    if ((vischar->direction & vischar_DIRECTION_MASK) != (room_and_flags & door_FLAGS_MASK_DIRECTION))
      continue;

    /* Skip any door which is more than three units away. */
    doormappos = &door->mappos;
    mappos = &state->saved_mappos.pos16; // reusing saved_mappos as 8-bit here? a case for saved_mappos being a union of pos8 and pos types?
    u = doormappos->u;
    if (u - 3 >= mappos->u || u + 3 < mappos->u) // -3 .. +2
      continue;
    v = doormappos->v;
    if (v - 3 >= mappos->v || v + 3 < mappos->v) // -3 .. +2
      continue;

    if (is_door_locked(state))
      return; /* The door was locked. */

    vischar->room = room_and_flags >> 2;

    doormappos = &door[1].mappos;
    if (state->current_door & door_REVERSE)
      doormappos = &door[-1].mappos;

    transition(state, doormappos); /* was tail call */
    NEVER_RETURNS; // check
  }
}